

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

int ps_alignment_add_word(ps_alignment_t *al,int32 wid,int start,int duration)

{
  ps_alignment_entry_t *ppVar1;
  ps_alignment_entry_t *ent;
  int duration_local;
  int start_local;
  int32 wid_local;
  ps_alignment_t *al_local;
  
  ppVar1 = ps_alignment_vector_grow_one(&al->word);
  if (ppVar1 == (ps_alignment_entry_t *)0x0) {
    al_local._4_4_ = 0;
  }
  else {
    (ppVar1->id).wid = wid;
    ppVar1->start = start;
    ppVar1->duration = duration;
    ppVar1->score = 0;
    ppVar1->parent = -1;
    ppVar1->child = -1;
    al_local._4_4_ = (uint)(al->word).n_ent;
  }
  return al_local._4_4_;
}

Assistant:

int
ps_alignment_add_word(ps_alignment_t *al,
                      int32 wid, int start, int duration)
{
    ps_alignment_entry_t *ent;

    if ((ent = ps_alignment_vector_grow_one(&al->word)) == NULL)
        return 0;
    ent->id.wid = wid;
    ent->start = start;
    ent->duration = duration;
    ent->score = 0;
    ent->parent = PS_ALIGNMENT_NONE;
    ent->child = PS_ALIGNMENT_NONE;

    return al->word.n_ent;
}